

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mplayer.cpp
# Opt level: O0

bool __thiscall V2MPlayer::Open(V2MPlayer *this,void *a_v2mptr,uint32_t a_samplerate)

{
  bool bVar1;
  uint32_t a_samplerate_local;
  void *a_v2mptr_local;
  V2MPlayer *this_local;
  
  if (((this->m_base).valid & 1U) != 0) {
    Close(this);
  }
  this->m_samplerate = a_samplerate;
  bVar1 = InitBase(this,a_v2mptr);
  if (bVar1) {
    Reset(this);
    (this->m_base).valid = true;
  }
  return bVar1;
}

Assistant:

bool V2MPlayer::Open(const void *a_v2mptr, uint32_t a_samplerate)
{
    if (m_base.valid)
        Close();

    m_samplerate = a_samplerate;

    if (!InitBase(a_v2mptr))
        return sFALSE;

    Reset();
    return m_base.valid = sTRUE;
}